

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

int __thiscall Socket::getSockOpt(Socket *this,int option)

{
  socklen_t local_28 [2];
  socklen_t optlen;
  int ret;
  int optval;
  int option_local;
  Socket *this_local;
  
  local_28[0] = 4;
  ret = option;
  _optval = this;
  this_local._4_4_ = getsockopt(this->SocketFileDescriptor,1,option,&optlen,local_28);
  if (-1 < (int)this_local._4_4_) {
    this_local._4_4_ = optlen;
  }
  return this_local._4_4_;
}

Assistant:

int Socket::getSockOpt(int option) {
  //XTRACE(IPC, DEB, "getSockOpt(%d), fd %d", option, SocketFileDescriptor);
  int optval, ret;
  socklen_t optlen;
  optlen = sizeof(optval);
  if ((ret = getsockopt(SocketFileDescriptor, SOL_SOCKET, option, (void *)&optval, &optlen)) <
      0) {
    //XTRACE(IPC, WAR, "getSockOpt(%d) failed, fd %d, ret %d", option, SocketFileDescriptor, ret);
    return ret;
  }
  return optval;
}